

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateList.hpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ParticlePairs::
generateList(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
            vector<double,_std::allocator<double>_> *ma,vector<double,_std::allocator<double>_> *mb,
            vector<double,_std::allocator<double>_> *za,vector<double,_std::allocator<double>_> *zb,
            vector<double,_std::allocator<double>_> *ia,vector<double,_std::allocator<double>_> *ib,
            vector<double,_std::allocator<double>_> *q,vector<int,_std::allocator<int>_> *pnt,
            vector<int,_std::allocator<int>_> *shf,vector<int,_std::allocator<int>_> *mt,
            vector<double,_std::allocator<double>_> *pa,vector<double,_std::allocator<double>_> *pb)

{
  iterator iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  uVar5 = (long)(ma->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ma->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar2 = uVar5 & 0xffffffff;
  local_48 = ia;
  local_40 = zb;
  local_38 = za;
  if (((((((long)(mb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(mb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3 == uVar2) &&
         ((long)(za->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(za->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 == uVar2)) &&
        ((long)(zb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(zb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3 == uVar2)) &&
       (((long)(ia->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(ia->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3 == uVar2 &&
        ((long)(ib->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(ib->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3 == uVar2)))) &&
      (((long)(q->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(q->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar2 &&
       (((long)(pnt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)(pnt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start >> 2 == uVar2 &&
        ((long)(shf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)(shf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start >> 2 == uVar2)))))) &&
     (((long)(mt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)(mt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start >> 2 == uVar2 &&
      (((long)(pa->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pa->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar2 &&
       ((long)(pb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar2)))))) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((uint)uVar5 != 0) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        pdVar4 = (double *)
                 ((long)(ma->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pdVar4 = (double *)
                 ((long)(mb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pdVar4 = (double *)
                 ((long)(local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pdVar4 = (double *)
                 ((long)(local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pdVar4 = (double *)
                 ((long)(local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pdVar4 = (double *)
                 ((long)(ib->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pdVar4 = (double *)
                 ((long)(q->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_50 = (double)*(int *)((long)(pnt->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar6);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar1,&local_50);
        }
        else {
          *iVar1._M_current = local_50;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_50 = (double)*(int *)((long)(shf->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar6);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar1,&local_50);
        }
        else {
          *iVar1._M_current = local_50;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_50 = (double)*(int *)((long)(mt->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar6);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar1,&local_50);
        }
        else {
          *iVar1._M_current = local_50;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pdVar4 = (double *)
                 ((long)(pa->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        pdVar4 = (double *)
                 ((long)(pb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar7);
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar1,pdVar4);
        }
        else {
          *iVar1._M_current = *pdVar4;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        lVar7 = lVar7 + 8;
        lVar6 = lVar6 + 4;
      } while ((uVar5 & 0xffffffff) << 3 != lVar7);
    }
    return __return_storage_ptr__;
  }
  tools::Log::info<char_const*>
            ("The number of particle pairs and the particle pair is not consistent");
  tools::Log::info<char_const*,unsigned_int>("NPP value: {}",(uint)uVar5);
  tools::Log::info<char_const*,unsigned_long>
            ("ma.size(): {}",
             (long)(ma->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ma->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("mb.size(): {}",
             (long)(mb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(mb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("za.size(): {}",
             (long)(local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("zb.size(): {}",
             (long)(local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("ia.size(): {}",
             (long)(local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("ib.size(): {}",
             (long)(ib->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ib->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("q.size(): {}",
             (long)(q->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(q->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("pnt.size(): {}",
             (long)(pnt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pnt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("shf.size(): {}",
             (long)(shf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(shf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("mt.size(): {}",
             (long)(mt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(mt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("pa.size(): {}",
             (long)(pa->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pa->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  tools::Log::info<char_const*,unsigned_long>
            ("pb.size(): {}",
             (long)(pb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< double >
generateList( std::vector< double >&& ma, std::vector< double >&& mb,
              std::vector< double >&& za, std::vector< double >&& zb,
              std::vector< double >&& ia, std::vector< double >&& ib,
              std::vector< double >&& q, std::vector< int >&& pnt,
              std::vector< int >&& shf, std::vector< int >&& mt,
              std::vector< double >&& pa, std::vector< double >&& pb ) {

  unsigned int npp = ma.size();
  if ( ( mb.size() != npp ) or
       ( za.size() != npp ) or ( zb.size() != npp ) or
       ( ia.size() != npp ) or ( ib.size() != npp ) or
       ( q.size() != npp ) or ( pnt.size() != npp ) or
       ( shf.size() != npp ) or ( mt.size() != npp ) or
       ( pa.size() != npp ) or ( pb.size() != npp ) ) {

    Log::info( "The number of particle pairs and the particle pair is not "
               "consistent" );
    Log::info( "NPP value: {}", npp );
    Log::info( "ma.size(): {}", ma.size() );
    Log::info( "mb.size(): {}", mb.size() );
    Log::info( "za.size(): {}", za.size() );
    Log::info( "zb.size(): {}", zb.size() );
    Log::info( "ia.size(): {}", ia.size() );
    Log::info( "ib.size(): {}", ib.size() );
    Log::info( "q.size(): {}", q.size() );
    Log::info( "pnt.size(): {}", pnt.size() );
    Log::info( "shf.size(): {}", shf.size() );
    Log::info( "mt.size(): {}", mt.size() );
    Log::info( "pa.size(): {}", pa.size() );
    Log::info( "pb.size(): {}", pb.size() );
    throw std::exception();
  }

  std::vector< double > list;
  for ( unsigned int i = 0; i < npp; ++i ) {

    list.push_back( ma[i] );
    list.push_back( mb[i] );
    list.push_back( za[i] );
    list.push_back( zb[i] );
    list.push_back( ia[i] );
    list.push_back( ib[i] );
    list.push_back( q[i] );
    list.push_back( pnt[i] );
    list.push_back( shf[i] );
    list.push_back( mt[i] );
    list.push_back( pa[i] );
    list.push_back( pb[i] );
  }
  return list;
}